

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_BlindTxOutUncompressedPubkeyTest_Test::TestBody
          (ConfidentialTransaction_BlindTxOutUncompressedPubkeyTest_Test *this)

{
  bool bVar1;
  undefined1 extraout_DL;
  char *message;
  ConfidentialAssetId local_248;
  AssertHelper local_220;
  AssertionResult gtest_ar;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> blind_list;
  int local_1cc;
  Pubkey pubkey2;
  Pubkey pubkey1;
  string pubkey2_hex;
  string pubkey1_hex;
  string inputassetblinder;
  string inputasset;
  string inputblinder;
  BlindParameter param;
  string tx_hex;
  ConfidentialTransaction tx;
  
  std::__cxx11::string::string
            ((string *)&tx_hex,
             "020000000001438cbb074e26715c25a11d12ef22f8e6080c466ff607936208473787138ba95a0000000000ffffffff0301f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000895440001976a914dff13ae1f9b4ce176adbeef85db623a6ee5a907988ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000000f1b30001976a914de89a605e67cabd0391ecc8b01ba1ec9434394fe88ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000002710000000000000"
             ,(allocator *)&param);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,(string *)&tx_hex);
  std::__cxx11::string::string
            ((string *)&inputblinder,
             "0000000000000000000000000000000000000000000000000000000000000000",(allocator *)&param)
  ;
  std::__cxx11::string::string
            ((string *)&inputasset,
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",(allocator *)&param)
  ;
  std::__cxx11::string::string
            ((string *)&inputassetblinder,
             "0000000000000000000000000000000000000000000000000000000000000000",(allocator *)&param)
  ;
  std::__cxx11::string::string
            ((string *)&pubkey1_hex,
             "04dada4cf7659309225a0a7cc34b7281fde98181a871ff9666ee7118895fe2a659d5f346c08488fb6a73a0d92ad1b547e58265b338fb2e73cea9ae6cd224225e22"
             ,(allocator *)&param);
  std::__cxx11::string::string
            ((string *)&pubkey2_hex,
             "04964523753907b96be824651f55eac8aead20f97759333813b3c0d9edc213e6abbce207ea330383fdccc5c78e9cd89f3eae8ed6089ddb7dd0878c7836e82e38bd"
             ,(allocator *)&param);
  cfd::core::Pubkey::Pubkey(&pubkey1,(string *)&pubkey1_hex);
  cfd::core::Pubkey::Pubkey(&pubkey2,(string *)&pubkey2_hex);
  blind_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blind_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blind_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::UnblindParameter::UnblindParameter(&param);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_248,(string *)&inputasset);
  cfd::core::ConfidentialAssetId::operator=(&param.asset,&local_248);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_248);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_248,(string *)&inputassetblinder);
  cfd::core::BlindFactor::operator=(&param.abf,(BlindFactor *)&local_248);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_248);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_248,(string *)&inputblinder);
  cfd::core::BlindFactor::operator=(&param.vbf,(BlindFactor *)&local_248);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_248);
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)cfd::core::Amount::CreateByCoinAmount(0.1);
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(pubkeys.
                         super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                         _M_impl.super__Vector_impl_data._M_finish._1_7_,extraout_DL);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&local_248,(Amount *)&pubkeys);
  cfd::core::ConfidentialValue::operator=(&param.value,(ConfidentialValue *)&local_248);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_248);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::push_back
            (&blind_list,&param);
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back(&pubkeys,&pubkey1);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back(&pubkeys,&pubkey2);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_248);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
  emplace_back<cfd::core::Pubkey>(&pubkeys,(Pubkey *)&local_248);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_248);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::BlindTxOut
                ((vector *)&tx,(vector *)&blind_list,(long)&pubkeys,1,0,(vector *)0x34);
    }
  }
  else {
    testing::Message::Message((Message *)&local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x3c3,
               "Expected: (tx.BlindTxOut(blind_list, pubkeys)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_248);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  local_220.data_ =
       (AssertHelperData *)
       local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1cc = 0x4514;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"tx.GetHex().length()","17684",(unsigned_long *)&local_220,
             &local_1cc);
  std::__cxx11::string::~string((string *)&local_248);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_248);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x3c5,message);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_248);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pubkeys);
  cfd::core::UnblindParameter::~UnblindParameter(&param);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            (&blind_list);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey1);
  std::__cxx11::string::~string((string *)&pubkey2_hex);
  std::__cxx11::string::~string((string *)&pubkey1_hex);
  std::__cxx11::string::~string((string *)&inputassetblinder);
  std::__cxx11::string::~string((string *)&inputasset);
  std::__cxx11::string::~string((string *)&inputblinder);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  std::__cxx11::string::~string((string *)&tx_hex);
  return;
}

Assistant:

TEST(ConfidentialTransaction, BlindTxOutUncompressedPubkeyTest) {
  std::string tx_hex = "020000000001438cbb074e26715c25a11d12ef22f8e6080c466ff607936208473787138ba95a0000000000ffffffff0301f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000895440001976a914dff13ae1f9b4ce176adbeef85db623a6ee5a907988ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000000f1b30001976a914de89a605e67cabd0391ecc8b01ba1ec9434394fe88ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000002710000000000000";
  ConfidentialTransaction tx(tx_hex);
  double inputamount = 0.1;
  std::string inputblinder =
      "0000000000000000000000000000000000000000000000000000000000000000";
  std::string inputasset =
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3";
  std::string inputassetblinder =
      "0000000000000000000000000000000000000000000000000000000000000000";
  std::string pubkey1_hex =
      "04dada4cf7659309225a0a7cc34b7281fde98181a871ff9666ee7118895fe2a659d5f346c08488fb6a73a0d92ad1b547e58265b338fb2e73cea9ae6cd224225e22";
  std::string pubkey2_hex =
      "04964523753907b96be824651f55eac8aead20f97759333813b3c0d9edc213e6abbce207ea330383fdccc5c78e9cd89f3eae8ed6089ddb7dd0878c7836e82e38bd";
  Pubkey pubkey1(pubkey1_hex);
  Pubkey pubkey2(pubkey2_hex);

  std::vector<BlindParameter> blind_list;
  BlindParameter param;
  param.asset = ConfidentialAssetId(inputasset);
  param.abf = BlindFactor(inputassetblinder);
  param.vbf = BlindFactor(inputblinder);
  param.value = ConfidentialValue(Amount::CreateByCoinAmount(inputamount));
  blind_list.push_back(param);
  std::vector<Pubkey> pubkeys;
  pubkeys.push_back(pubkey1);
  pubkeys.push_back(pubkey2);
  pubkeys.push_back(Pubkey());

  EXPECT_NO_THROW((tx.BlindTxOut(blind_list, pubkeys)));
  // 乱数が混ざるため、サイズだけチェック
  EXPECT_EQ(tx.GetHex().length(), 17684);
}